

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O3

void * lj_alloc_malloc(void *msp,size_t nsize)

{
  ulong *puVar1;
  byte *pbVar2;
  void *pvVar3;
  undefined1 (*pauVar4) [16];
  undefined8 uVar5;
  uint uVar6;
  long lVar7;
  void *pvVar8;
  undefined1 (*pauVar9) [16];
  long lVar10;
  undefined1 (*pauVar11) [16];
  ulong uVar12;
  size_t dvs;
  undefined1 (*pauVar13) [16];
  ulong uVar14;
  undefined8 *puVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  ulong *puVar19;
  ulong uVar20;
  long lVar21;
  long *plVar22;
  byte bVar23;
  ulong uVar24;
  long lVar25;
  undefined8 *puVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  if (nsize < 0xf1) {
    uVar12 = 0x20;
    if (0x16 < nsize) {
      uVar12 = (ulong)((int)nsize + 0xfU & 0x1f8);
    }
    uVar16 = *msp;
    bVar23 = (byte)(uVar12 >> 3);
    uVar18 = uVar16 >> (bVar23 & 0x1f);
    if ((uVar18 & 3) != 0) {
      uVar18 = (~uVar18 & 1) + (int)(uVar12 >> 3);
      lVar7 = (long)msp + (ulong)(uVar18 * 0x10) + 0x38;
      lVar10 = *(long *)((long)msp + (ulong)(uVar18 * 0x10) + 0x48);
      lVar21 = *(long *)(lVar10 + 0x10);
      if (lVar7 == lVar21) {
        *(uint *)msp = uVar16 & ~(1 << (uVar18 & 0x1f));
      }
      else {
        *(long *)((long)msp + (ulong)(uVar18 * 0x10) + 0x48) = lVar21;
        *(long *)(lVar21 + 0x18) = lVar7;
      }
      *(ulong *)(lVar10 + 8) = (ulong)(uVar18 * 8) + 3;
      pbVar2 = (byte *)(lVar10 + 8 + (ulong)(uVar18 * 8));
      *pbVar2 = *pbVar2 | 1;
      return (void *)(lVar10 + 0x10);
    }
    uVar14 = *(ulong *)((long)msp + 8);
    if (uVar14 < uVar12) {
      if (uVar16 >> (bVar23 & 0x1f) != 0) {
        uVar6 = 2 << (bVar23 & 0x1f);
        uVar6 = (-uVar6 | uVar6) & uVar18 << (bVar23 & 0x1f);
        uVar18 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
          }
        }
        uVar6 = uVar18 << 4;
        lVar7 = (long)msp + (ulong)uVar6 + 0x38;
        lVar10 = *(long *)((long)msp + (ulong)uVar6 + 0x48);
        lVar21 = *(long *)(lVar10 + 0x10);
        if (lVar7 == lVar21) {
          uVar16 = uVar16 & ~(1 << (uVar18 & 0x1f));
          *(uint *)msp = uVar16;
        }
        else {
          *(long *)((long)msp + (ulong)uVar6 + 0x48) = lVar21;
          *(long *)(lVar21 + 0x18) = lVar7;
        }
        uVar24 = (ulong)(uVar18 * 8);
        uVar20 = uVar24 - uVar12;
        if (0x1f < uVar20) {
          *(ulong *)(lVar10 + 8) = uVar12 | 3;
          *(ulong *)(lVar10 + 8 + uVar12) = uVar20 | 1;
          *(ulong *)(lVar10 + uVar24) = uVar20;
          if (uVar14 != 0) {
            lVar21 = *(long *)((long)msp + 0x18);
            uVar14 = uVar14 >> 3;
            lVar7 = (long)msp + uVar14 * 0x10 + 0x38;
            if ((uVar16 >> ((uint)uVar14 & 0x1f) & 1) == 0) {
              *(uint *)msp = uVar16 | 1 << ((byte)uVar14 & 0x1f);
              lVar25 = lVar7;
            }
            else {
              lVar25 = *(long *)(lVar7 + 0x10);
            }
            *(long *)(lVar7 + 0x10) = lVar21;
            *(long *)(lVar25 + 0x18) = lVar21;
            *(long *)(lVar21 + 0x10) = lVar25;
            *(long *)(lVar21 + 0x18) = lVar7;
          }
          *(ulong *)((long)msp + 8) = uVar20;
          *(ulong *)((long)msp + 0x18) = lVar10 + uVar12;
          return (void *)(lVar10 + 0x10);
        }
        *(ulong *)(lVar10 + 8) = uVar24 | 3;
        pbVar2 = (byte *)(lVar10 + 8 + uVar24);
        *pbVar2 = *pbVar2 | 1;
        return (void *)(lVar10 + 0x10);
      }
      uVar18 = *(uint *)((long)msp + 4);
      if (uVar18 != 0) {
        uVar6 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        lVar10 = *(long *)((long)msp + (ulong)uVar6 * 8 + 0x248);
        uVar20 = (*(ulong *)(lVar10 + 8) & 0xfffffffffffffffc) - uVar12;
        lVar21 = lVar10;
        while ((lVar7 = *(long *)(lVar21 + 0x20), lVar7 != 0 ||
               (lVar7 = *(long *)(lVar21 + 0x28), lVar7 != 0))) {
          uVar24 = (*(ulong *)(lVar7 + 8) & 0xfffffffffffffffc) - uVar12;
          lVar21 = lVar7;
          if (uVar24 < uVar20) {
            lVar10 = lVar7;
            uVar20 = uVar24;
          }
        }
        lVar21 = *(long *)(lVar10 + 0x18);
        lVar7 = *(long *)(lVar10 + 0x30);
        if (lVar21 == lVar10) {
          if (*(long *)(lVar10 + 0x28) == 0) {
            if (*(long *)(lVar10 + 0x20) == 0) {
              lVar21 = 0;
              goto LAB_0011f462;
            }
            lVar25 = *(long *)(lVar10 + 0x20);
            puVar15 = (undefined8 *)(lVar10 + 0x20);
          }
          else {
            lVar25 = *(long *)(lVar10 + 0x28);
            puVar15 = (undefined8 *)(lVar10 + 0x28);
          }
          do {
            do {
              puVar26 = puVar15;
              lVar21 = lVar25;
              lVar25 = *(long *)(lVar21 + 0x28);
              puVar15 = (undefined8 *)(lVar21 + 0x28);
            } while (*(long *)(lVar21 + 0x28) != 0);
            lVar25 = *(long *)(lVar21 + 0x20);
            puVar15 = (undefined8 *)(lVar21 + 0x20);
          } while (*(long *)(lVar21 + 0x20) != 0);
          *puVar26 = 0;
        }
        else {
          lVar25 = *(long *)(lVar10 + 0x10);
          *(long *)(lVar25 + 0x18) = lVar21;
          *(long *)(lVar21 + 0x10) = lVar25;
        }
LAB_0011f462:
        if (lVar7 != 0) {
          lVar25 = *(long *)(lVar10 + 0x38);
          if (lVar10 == *(long *)((long)msp + lVar25 * 8 + 0x248)) {
            *(long *)((long)msp + lVar25 * 8 + 0x248) = lVar21;
            if (lVar21 != 0) goto LAB_0011f497;
            *(uint *)((long)msp + 4) = uVar18 & ~(1 << ((uint)lVar25 & 0x1f));
          }
          else {
            *(long *)(lVar7 + 0x20 + (ulong)(*(long *)(lVar7 + 0x20) != lVar10) * 8) = lVar21;
            if (lVar21 != 0) {
LAB_0011f497:
              *(long *)(lVar21 + 0x30) = lVar7;
              lVar7 = *(long *)(lVar10 + 0x20);
              if (lVar7 != 0) {
                *(long *)(lVar21 + 0x20) = lVar7;
                *(long *)(lVar7 + 0x30) = lVar21;
              }
              lVar7 = *(long *)(lVar10 + 0x28);
              if (lVar7 != 0) {
                *(long *)(lVar21 + 0x28) = lVar7;
                *(long *)(lVar7 + 0x30) = lVar21;
              }
            }
          }
        }
        if (uVar20 < 0x20) {
          *(ulong *)(lVar10 + 8) = uVar20 + uVar12 | 3;
          pbVar2 = (byte *)(lVar10 + 8 + uVar20 + uVar12);
          *pbVar2 = *pbVar2 | 1;
        }
        else {
          *(ulong *)(lVar10 + 8) = uVar12 | 3;
          *(ulong *)(lVar10 + 8 + uVar12) = uVar20 | 1;
          *(ulong *)(lVar10 + uVar12 + uVar20) = uVar20;
          if (uVar14 != 0) {
            lVar21 = *(long *)((long)msp + 0x18);
            uVar14 = uVar14 >> 3;
            lVar7 = (long)msp + uVar14 * 0x10 + 0x38;
            if ((uVar16 >> ((uint)uVar14 & 0x1f) & 1) == 0) {
              *(uint *)msp = 1 << ((byte)uVar14 & 0x1f) | uVar16;
              lVar25 = lVar7;
            }
            else {
              lVar25 = *(long *)((long)msp + uVar14 * 0x10 + 0x48);
            }
            *(long *)((long)msp + uVar14 * 0x10 + 0x48) = lVar21;
            *(long *)(lVar25 + 0x18) = lVar21;
            *(long *)(lVar21 + 0x10) = lVar25;
            *(long *)(lVar21 + 0x18) = lVar7;
          }
          *(ulong *)((long)msp + 8) = uVar20;
          *(ulong *)((long)msp + 0x18) = lVar10 + uVar12;
        }
        goto LAB_0011ecb7;
      }
    }
  }
  else {
    uVar12 = 0xffffffffffffffff;
    if (nsize < 0xffffffffffffff80) {
      uVar12 = nsize + 0xf & 0xfffffffffffffff8;
      uVar16 = *(uint *)((long)msp + 4);
      if (uVar16 != 0) {
        uVar18 = (uint)(nsize + 0xf >> 8);
        if (uVar18 == 0) {
          uVar14 = 0;
        }
        else {
          uVar14 = 0x1f;
          if (uVar18 < 0x10000) {
            uVar6 = 0x1f;
            if (uVar18 != 0) {
              for (; uVar18 >> uVar6 == 0; uVar6 = uVar6 - 1) {
              }
            }
            uVar14 = (ulong)((uVar12 >> ((ulong)(byte)(0x26 - (char)(uVar6 ^ 0x1f)) & 0x3f) & 1) !=
                            0) | (ulong)((uVar6 ^ 0x1f) * 2 ^ 0x3e);
          }
        }
        uVar20 = -uVar12;
        lVar10 = *(long *)((long)msp + uVar14 * 8 + 0x248);
        if (lVar10 == 0) {
          lVar21 = 0;
          lVar7 = 0;
        }
        else {
          bVar23 = 0x39 - (char)(uVar14 >> 1);
          if (uVar14 == 0x1f) {
            bVar23 = 0;
          }
          lVar25 = uVar12 << (bVar23 & 0x3f);
          lVar21 = 0;
          lVar7 = 0;
          do {
            uVar24 = (*(ulong *)(lVar10 + 8) & 0xfffffffffffffffc) - uVar12;
            if ((uVar24 < uVar20) && (lVar7 = lVar10, uVar20 = uVar24, uVar24 == 0)) {
              uVar20 = 0;
              goto LAB_0011eb63;
            }
            lVar17 = *(long *)(lVar10 + 0x28);
            lVar10 = *(long *)(lVar10 + 0x20 + (lVar25 >> 0x3f) * -8);
            lVar27 = lVar17;
            if (lVar17 == lVar10) {
              lVar27 = lVar21;
            }
            if (lVar17 != 0) {
              lVar21 = lVar27;
            }
            lVar25 = lVar25 * 2;
          } while (lVar10 != 0);
        }
        lVar10 = lVar7;
        if (lVar21 == 0 && lVar7 == 0) {
          uVar18 = 2 << ((byte)uVar14 & 0x1f);
          uVar18 = (-uVar18 | uVar18) & uVar16;
          if (uVar18 == 0) goto LAB_0011ebc4;
          uVar6 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          lVar21 = *(long *)((long)msp + (ulong)uVar6 * 8 + 0x248);
          lVar10 = 0;
        }
        while (lVar7 = lVar21, lVar21 != 0) {
LAB_0011eb63:
          uVar24 = (*(ulong *)(lVar7 + 8) & 0xfffffffffffffffc) - uVar12;
          uVar14 = uVar24;
          if (uVar20 <= uVar24) {
            uVar14 = uVar20;
          }
          lVar21 = *(long *)(lVar7 + 0x20);
          if (uVar20 > uVar24) {
            lVar10 = lVar7;
          }
          uVar20 = uVar14;
          if (lVar21 == 0) {
            lVar21 = *(long *)(lVar7 + 0x28);
          }
        }
        if ((lVar10 != 0) && (uVar20 < *(long *)((long)msp + 8) - uVar12)) {
          lVar21 = *(long *)(lVar10 + 0x18);
          lVar7 = *(long *)(lVar10 + 0x30);
          if (lVar21 == lVar10) {
            if (*(long *)(lVar10 + 0x28) == 0) {
              if (*(long *)(lVar10 + 0x20) == 0) {
                lVar21 = 0;
                goto LAB_0011f11e;
              }
              lVar25 = *(long *)(lVar10 + 0x20);
              puVar15 = (undefined8 *)(lVar10 + 0x20);
            }
            else {
              lVar25 = *(long *)(lVar10 + 0x28);
              puVar15 = (undefined8 *)(lVar10 + 0x28);
            }
            do {
              do {
                puVar26 = puVar15;
                lVar21 = lVar25;
                lVar25 = *(long *)(lVar21 + 0x28);
                puVar15 = (undefined8 *)(lVar21 + 0x28);
              } while (*(long *)(lVar21 + 0x28) != 0);
              lVar25 = *(long *)(lVar21 + 0x20);
              puVar15 = (undefined8 *)(lVar21 + 0x20);
            } while (*(long *)(lVar21 + 0x20) != 0);
            *puVar26 = 0;
          }
          else {
            lVar25 = *(long *)(lVar10 + 0x10);
            *(long *)(lVar25 + 0x18) = lVar21;
            *(long *)(lVar21 + 0x10) = lVar25;
          }
LAB_0011f11e:
          if (lVar7 != 0) {
            lVar25 = *(long *)(lVar10 + 0x38);
            if (lVar10 == *(long *)((long)msp + lVar25 * 8 + 0x248)) {
              *(long *)((long)msp + lVar25 * 8 + 0x248) = lVar21;
              if (lVar21 != 0) goto LAB_0011f158;
              *(uint *)((long)msp + 4) = uVar16 & ~(1 << ((uint)lVar25 & 0x1f));
            }
            else {
              *(long *)(lVar7 + 0x20 + (ulong)(*(long *)(lVar7 + 0x20) != lVar10) * 8) = lVar21;
              if (lVar21 != 0) {
LAB_0011f158:
                *(long *)(lVar21 + 0x30) = lVar7;
                lVar7 = *(long *)(lVar10 + 0x20);
                if (lVar7 != 0) {
                  *(long *)(lVar21 + 0x20) = lVar7;
                  *(long *)(lVar7 + 0x30) = lVar21;
                }
                lVar7 = *(long *)(lVar10 + 0x28);
                if (lVar7 != 0) {
                  *(long *)(lVar21 + 0x28) = lVar7;
                  *(long *)(lVar7 + 0x30) = lVar21;
                }
              }
            }
          }
          if (uVar20 < 0x20) {
            *(ulong *)(lVar10 + 8) = uVar20 + uVar12 | 3;
            pbVar2 = (byte *)(lVar10 + 8 + uVar20 + uVar12);
            *pbVar2 = *pbVar2 | 1;
          }
          else {
            lVar21 = lVar10 + uVar12;
            *(ulong *)(lVar10 + 8) = uVar12 | 3;
            *(ulong *)(lVar10 + 8 + uVar12) = uVar20 | 1;
            *(ulong *)(lVar21 + uVar20) = uVar20;
            if (uVar20 < 0x100) {
              uVar20 = uVar20 >> 3;
              lVar7 = (long)msp + uVar20 * 0x10 + 0x38;
              if ((*msp >> ((uint)uVar20 & 0x1f) & 1) == 0) {
                *(uint *)msp = *msp | 1 << ((byte)uVar20 & 0x1f);
                lVar25 = lVar7;
              }
              else {
                lVar25 = *(long *)((long)msp + uVar20 * 0x10 + 0x48);
              }
              *(long *)((long)msp + uVar20 * 0x10 + 0x48) = lVar21;
              *(long *)(lVar25 + 0x18) = lVar21;
              *(long *)(lVar21 + 0x10) = lVar25;
              *(long *)(lVar21 + 0x18) = lVar7;
            }
            else {
              uVar16 = (uint)(uVar20 >> 8);
              if (uVar16 == 0) {
                uVar12 = 0;
              }
              else {
                uVar12 = 0x1f;
                if (uVar16 < 0x10000) {
                  uVar18 = 0x1f;
                  if (uVar16 != 0) {
                    for (; uVar16 >> uVar18 == 0; uVar18 = uVar18 - 1) {
                    }
                  }
                  uVar12 = (ulong)((uint)((uVar20 >> ((ulong)(byte)(0x26 - (char)(uVar18 ^ 0x1f)) &
                                                     0x3f) & 1) != 0) | (uVar18 ^ 0x1f) * 2 ^ 0x3e);
                }
              }
              plVar22 = (long *)((long)msp + uVar12 * 8 + 0x248);
              *(ulong *)(lVar21 + 0x38) = uVar12;
              *(undefined1 (*) [16])(lVar21 + 0x20) = (undefined1  [16])0x0;
              if ((*(uint *)((long)msp + 4) >> ((uint)uVar12 & 0x1f) & 1) == 0) {
                *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar12 & 0x1f);
                *plVar22 = lVar21;
                *(long **)(lVar21 + 0x30) = plVar22;
              }
              else {
                bVar23 = 0x39 - (char)(uVar12 >> 1);
                if (uVar12 == 0x1f) {
                  bVar23 = 0;
                }
                lVar25 = uVar20 << (bVar23 & 0x3f);
                lVar7 = *plVar22;
                do {
                  lVar17 = lVar7;
                  if ((*(ulong *)(lVar17 + 8) & 0xfffffffffffffffc) == uVar20) {
                    lVar7 = *(long *)(lVar17 + 0x10);
                    *(long *)(lVar7 + 0x18) = lVar21;
                    *(long *)(lVar17 + 0x10) = lVar21;
                    *(long *)(lVar21 + 0x10) = lVar7;
                    *(long *)(lVar21 + 0x18) = lVar17;
                    *(undefined8 *)(lVar21 + 0x30) = 0;
                    goto LAB_0011ecb7;
                  }
                  lVar27 = lVar25 >> 0x3f;
                  lVar25 = lVar25 * 2;
                  lVar7 = *(long *)(lVar17 + 0x20 + lVar27 * -8);
                } while (lVar7 != 0);
                *(long *)(lVar17 + 0x20 + lVar27 * -8) = lVar21;
                *(long *)(lVar21 + 0x30) = lVar17;
              }
              *(long *)(lVar21 + 0x18) = lVar21;
              *(long *)(lVar21 + 0x10) = lVar21;
            }
          }
          goto LAB_0011ecb7;
        }
      }
    }
  }
LAB_0011ebc4:
  uVar14 = *(ulong *)((long)msp + 8);
  uVar20 = uVar14 - uVar12;
  if (uVar12 <= uVar14) {
    lVar10 = *(long *)((long)msp + 0x18);
    if (uVar20 < 0x20) {
      *(ulong *)(lVar10 + 8) = uVar14 | 3;
      pbVar2 = (byte *)(lVar10 + 8 + uVar14);
      *pbVar2 = *pbVar2 | 1;
      lVar21 = 0;
      uVar20 = 0;
    }
    else {
      lVar21 = lVar10 + uVar12;
      *(ulong *)(lVar10 + 8 + uVar12) = uVar20 | 1;
      *(ulong *)(lVar10 + uVar14) = uVar20;
      *(ulong *)(lVar10 + 8) = uVar12 | 3;
    }
    *(long *)((long)msp + 0x18) = lVar21;
    *(ulong *)((long)msp + 8) = uVar20;
    goto LAB_0011ecb7;
  }
  uVar14 = *(ulong *)((long)msp + 0x10) - uVar12;
  if (*(ulong *)((long)msp + 0x10) < uVar12 || uVar14 == 0) {
    if ((0x1ffff < uVar12) && (pvVar8 = direct_alloc((mstate)msp,uVar12), pvVar8 != (void *)0x0)) {
      return pvVar8;
    }
    uVar14 = uVar12 + 0x20040 & 0xfffffffffffe0000;
    if (uVar14 <= uVar12) {
      return (void *)0x0;
    }
    pvVar8 = mmap_probe(*(PRNGState **)((long)msp + 0x360),uVar14);
    if (pvVar8 == (void *)0xffffffffffffffff) {
      return (void *)0x0;
    }
    puVar1 = (ulong *)((long)msp + 0x348);
    puVar19 = puVar1;
    do {
      if (pvVar8 == (void *)((long)*puVar19 + puVar19[1])) {
        pvVar3 = *(void **)((long)msp + 0x20);
        if (((void *)*puVar19 <= pvVar3) && (pvVar3 < pvVar8)) {
          puVar19[1] = puVar19[1] + uVar14;
          lVar10 = uVar14 + *(long *)((long)msp + 0x10);
          uVar14 = (ulong)(-(int)pvVar3 - 0x10U & 7);
          uVar20 = lVar10 - uVar14;
          *(ulong *)((long)msp + 0x20) = (long)pvVar3 + uVar14;
          *(ulong *)((long)msp + 0x10) = uVar20;
          *(ulong *)((long)pvVar3 + uVar14 + 8) = uVar20 | 1;
          *(undefined8 *)((long)pvVar3 + lVar10 + 8) = 0x40;
          *(undefined8 *)((long)msp + 0x28) = 0x200000;
          goto LAB_0011f416;
        }
        break;
      }
      puVar19 = (ulong *)puVar19[2];
    } while (puVar19 != (ulong *)0x0);
    puVar19 = puVar1;
    while( true ) {
      uVar20 = *puVar19;
      if (uVar20 == (long)pvVar8 + uVar14) break;
      puVar19 = (ulong *)puVar19[2];
      if (puVar19 == (ulong *)0x0) goto code_r0x0011ed33;
    }
    *puVar19 = (ulong)pvVar8;
    puVar19[1] = puVar19[1] + uVar14;
    uVar24 = (ulong)(-(int)pvVar8 - 0x10U & 7);
    lVar21 = (-(int)uVar20 - 0x10U & 7) + uVar20;
    lVar10 = (long)pvVar8 + uVar12 + uVar24;
    uVar14 = lVar21 - lVar10;
    *(ulong *)((long)pvVar8 + uVar24 + 8) = uVar12 | 3;
    if (lVar21 == *(long *)((long)msp + 0x20)) {
      uVar14 = uVar14 + *(long *)((long)msp + 0x10);
      *(ulong *)((long)msp + 0x10) = uVar14;
      *(long *)((long)msp + 0x20) = lVar10;
      *(ulong *)(lVar10 + 8) = uVar14 | 1;
      goto LAB_0011f795;
    }
    if (lVar21 == *(long *)((long)msp + 0x18)) {
      uVar14 = uVar14 + *(long *)((long)msp + 8);
      *(ulong *)((long)msp + 8) = uVar14;
      *(long *)((long)msp + 0x18) = lVar10;
      *(ulong *)(lVar10 + 8) = uVar14 | 1;
      *(ulong *)(lVar10 + uVar14) = uVar14;
      goto LAB_0011f795;
    }
    uVar12 = *(ulong *)(lVar21 + 8);
    if ((uVar12 & 2) != 0) goto LAB_0011f63b;
    uVar20 = uVar12 & 0xfffffffffffffffc;
    lVar7 = *(long *)(lVar21 + 0x18);
    if (uVar12 < 0x100) {
      lVar25 = *(long *)(lVar21 + 0x10);
      if (lVar25 == lVar7) {
        bVar23 = (byte)(uVar12 >> 3) & 0x1f;
        *(uint *)msp = *msp & (-2 << bVar23 | 0xfffffffeU >> 0x20 - bVar23);
      }
      else {
        *(long *)(lVar25 + 0x18) = lVar7;
        *(long *)(lVar7 + 0x10) = lVar25;
      }
      goto LAB_0011f630;
    }
    lVar25 = *(long *)(lVar21 + 0x30);
    if (lVar7 != lVar21) {
      lVar17 = *(long *)(lVar21 + 0x10);
      *(long *)(lVar17 + 0x18) = lVar7;
      *(long *)(lVar7 + 0x10) = lVar17;
      goto LAB_0011f5c6;
    }
    if (*(long *)(lVar21 + 0x28) != 0) {
      lVar17 = *(long *)(lVar21 + 0x28);
      puVar15 = (undefined8 *)(lVar21 + 0x28);
      goto LAB_0011f59f;
    }
    if (*(long *)(lVar21 + 0x20) == 0) {
      lVar7 = 0;
    }
    else {
      lVar17 = *(long *)(lVar21 + 0x20);
      puVar15 = (undefined8 *)(lVar21 + 0x20);
LAB_0011f59f:
      do {
        do {
          puVar26 = puVar15;
          lVar7 = lVar17;
          lVar17 = *(long *)(lVar7 + 0x28);
          puVar15 = (undefined8 *)(lVar7 + 0x28);
        } while (*(long *)(lVar7 + 0x28) != 0);
        lVar17 = *(long *)(lVar7 + 0x20);
        puVar15 = (undefined8 *)(lVar7 + 0x20);
      } while (*(long *)(lVar7 + 0x20) != 0);
      *puVar26 = 0;
    }
LAB_0011f5c6:
    if (lVar25 != 0) {
      lVar17 = *(long *)(lVar21 + 0x38);
      if (lVar21 == *(long *)((long)msp + lVar17 * 8 + 0x248)) {
        *(long *)((long)msp + lVar17 * 8 + 0x248) = lVar7;
        if (lVar7 == 0) {
          bVar23 = (byte)lVar17 & 0x1f;
          *(uint *)((long)msp + 4) =
               *(uint *)((long)msp + 4) & (-2 << bVar23 | 0xfffffffeU >> 0x20 - bVar23);
          goto LAB_0011f630;
        }
      }
      else {
        *(long *)(lVar25 + 0x20 + (ulong)(*(long *)(lVar25 + 0x20) != lVar21) * 8) = lVar7;
        if (lVar7 == 0) goto LAB_0011f630;
      }
      *(long *)(lVar7 + 0x30) = lVar25;
      lVar25 = *(long *)(lVar21 + 0x20);
      if (lVar25 != 0) {
        *(long *)(lVar7 + 0x20) = lVar25;
        *(long *)(lVar25 + 0x30) = lVar7;
      }
      lVar25 = *(long *)(lVar21 + 0x28);
      if (lVar25 != 0) {
        *(long *)(lVar7 + 0x28) = lVar25;
        *(long *)(lVar25 + 0x30) = lVar7;
      }
    }
LAB_0011f630:
    uVar12 = *(ulong *)(lVar21 + 8 + uVar20);
    lVar21 = lVar21 + uVar20;
    uVar14 = uVar14 + uVar20;
LAB_0011f63b:
    *(ulong *)(lVar21 + 8) = uVar12 & 0xfffffffffffffffe;
    *(ulong *)(lVar10 + 8) = uVar14 | 1;
    *(ulong *)(lVar10 + uVar14) = uVar14;
    if (uVar14 < 0x100) {
      uVar14 = uVar14 >> 3;
      lVar21 = (long)msp + uVar14 * 0x10 + 0x38;
      if ((*msp >> ((uint)uVar14 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << ((byte)uVar14 & 0x1f);
        lVar7 = lVar21;
      }
      else {
        lVar7 = *(long *)((long)msp + uVar14 * 0x10 + 0x48);
      }
      *(long *)((long)msp + uVar14 * 0x10 + 0x48) = lVar10;
      *(long *)(lVar7 + 0x18) = lVar10;
      *(long *)(lVar10 + 0x10) = lVar7;
      *(long *)(lVar10 + 0x18) = lVar21;
    }
    else {
      uVar16 = (uint)(uVar14 >> 8);
      if (uVar16 == 0) {
        uVar12 = 0;
      }
      else {
        uVar12 = 0x1f;
        if (uVar16 < 0x10000) {
          uVar18 = 0x1f;
          if (uVar16 != 0) {
            for (; uVar16 >> uVar18 == 0; uVar18 = uVar18 - 1) {
            }
          }
          uVar12 = (ulong)((uint)((uVar14 >> ((ulong)(byte)(0x26 - (char)(uVar18 ^ 0x1f)) & 0x3f) &
                                  1) != 0) | (uVar18 ^ 0x1f) * 2 ^ 0x3e);
        }
      }
      plVar22 = (long *)((long)msp + uVar12 * 8 + 0x248);
      *(ulong *)(lVar10 + 0x38) = uVar12;
      *(undefined1 (*) [16])(lVar10 + 0x20) = (undefined1  [16])0x0;
      if ((*(uint *)((long)msp + 4) >> ((uint)uVar12 & 0x1f) & 1) == 0) {
        *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar12 & 0x1f);
        *plVar22 = lVar10;
        *(long **)(lVar10 + 0x30) = plVar22;
      }
      else {
        bVar23 = 0x39 - (char)(uVar12 >> 1);
        if (uVar12 == 0x1f) {
          bVar23 = 0;
        }
        lVar7 = uVar14 << (bVar23 & 0x3f);
        lVar21 = *plVar22;
        do {
          lVar25 = lVar21;
          if ((*(ulong *)(lVar25 + 8) & 0xfffffffffffffffc) == uVar14) {
            lVar21 = *(long *)(lVar25 + 0x10);
            *(long *)(lVar21 + 0x18) = lVar10;
            *(long *)(lVar25 + 0x10) = lVar10;
            *(long *)(lVar10 + 0x10) = lVar21;
            *(long *)(lVar10 + 0x18) = lVar25;
            *(undefined8 *)(lVar10 + 0x30) = 0;
            goto LAB_0011f795;
          }
          lVar17 = lVar7 >> 0x3f;
          lVar7 = lVar7 * 2;
          lVar21 = *(long *)(lVar25 + 0x20 + lVar17 * -8);
        } while (lVar21 != 0);
        *(long *)(lVar25 + 0x20 + lVar17 * -8) = lVar10;
        *(long *)(lVar10 + 0x30) = lVar25;
      }
      *(long *)(lVar10 + 0x18) = lVar10;
      *(long *)(lVar10 + 0x10) = lVar10;
    }
LAB_0011f795:
    return (void *)((long)pvVar8 + uVar24 + 0x10);
  }
  goto LAB_0011ebd9;
code_r0x0011ed33:
  pauVar4 = *(undefined1 (**) [16])((long)msp + 0x20);
  for (puVar19 = puVar1;
      (pauVar4 < (undefined1 (*) [16])*puVar19 ||
      (pauVar13 = (undefined1 (*) [16])(*(undefined1 (*) [16])*puVar19 + puVar19[1]),
      pauVar13 <= pauVar4)); puVar19 = (ulong *)puVar19[2]) {
  }
  pauVar11 = (undefined1 (*) [16])(pauVar13[-5] + (ulong)(0x37U - (int)pauVar13 & 7) + 9);
  if ((undefined1 (*) [16])(pauVar13[-5] + (ulong)(0x37U - (int)pauVar13 & 7) + 9) < pauVar4 + 2) {
    pauVar11 = pauVar4;
  }
  uVar24 = (ulong)(-(int)pvVar8 - 0x10U & 7);
  uVar20 = (uVar14 - 0x40) - uVar24;
  *(ulong *)((long)msp + 0x20) = (long)pvVar8 + uVar24;
  *(ulong *)((long)msp + 0x10) = uVar20;
  *(ulong *)((long)pvVar8 + uVar24 + 8) = uVar20 | 1;
  *(undefined8 *)((long)pvVar8 + (uVar14 - 0x38)) = 0x40;
  *(undefined8 *)((long)msp + 0x28) = 0x200000;
  *(undefined8 *)(*pauVar11 + 8) = 0x23;
  uVar5 = *(undefined8 *)((long)msp + 0x350);
  *(ulong *)pauVar11[1] = *puVar1;
  *(undefined8 *)(pauVar11[1] + 8) = uVar5;
  *(undefined8 *)pauVar11[2] = *(undefined8 *)((long)msp + 0x358);
  *(void **)((long)msp + 0x348) = pvVar8;
  *(ulong *)((long)msp + 0x350) = uVar14;
  *(undefined1 (**) [16])((long)msp + 0x358) = pauVar11 + 1;
  pauVar9 = pauVar11 + 3;
  if (pauVar11 + 3 < pauVar13) {
    pauVar9 = pauVar13;
  }
  uVar14 = (long)pauVar9 + (-0x29 - (long)pauVar11);
  auVar28._8_4_ = (int)uVar14;
  auVar28._0_8_ = uVar14;
  auVar28._12_4_ = (int)(uVar14 >> 0x20);
  uVar20 = 0;
  auVar29 = pmovsxbq(in_XMM1,0x100);
  do {
    if ((bool)(~((long)(uVar14 >> 3 | 0x8000000000000000) < (long)(uVar20 ^ 0x8000000000000000)) & 1
              )) {
      *(undefined8 *)(pauVar11[2] + uVar20 * 8 + 8) = 0xb;
    }
    auVar30._8_4_ = (int)uVar20;
    auVar30._0_8_ = uVar20;
    auVar30._12_4_ = (int)(uVar20 >> 0x20);
    if ((long)((auVar30._8_8_ | auVar29._8_8_) ^ 0x8000000000000000) <=
        (long)(auVar28._8_8_ >> 3 | 0x8000000000000000)) {
      *(undefined8 *)(pauVar11[3] + uVar20 * 8) = 0xb;
    }
    uVar20 = uVar20 + 2;
  } while (((uVar14 >> 3) + 2 & 0xfffffffffffffffe) != uVar20);
  uVar14 = (long)pauVar11 - (long)pauVar4;
  if (uVar14 != 0) {
    (*pauVar11)[8] = (*pauVar11)[8] & 0xfe;
    *(ulong *)(*pauVar4 + 8) = uVar14 | 1;
    *(ulong *)*pauVar11 = uVar14;
    if (uVar14 < 0x100) {
      uVar14 = uVar14 >> 3;
      pauVar13 = (undefined1 (*) [16])((long)msp + uVar14 * 0x10 + 0x38);
      if ((*msp >> ((uint)uVar14 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << ((byte)uVar14 & 0x1f);
        pauVar11 = pauVar13;
      }
      else {
        pauVar11 = *(undefined1 (**) [16])((long)msp + uVar14 * 0x10 + 0x48);
      }
      *(undefined1 (**) [16])((long)msp + uVar14 * 0x10 + 0x48) = pauVar4;
      *(undefined1 (**) [16])(pauVar11[1] + 8) = pauVar4;
      lVar10 = 0x18;
      lVar21 = 0x10;
    }
    else {
      uVar16 = (uint)(uVar14 >> 8);
      if (uVar16 == 0) {
        uVar20 = 0;
      }
      else {
        uVar20 = 0x1f;
        if (uVar16 < 0x10000) {
          uVar18 = 0x1f;
          if (uVar16 != 0) {
            for (; uVar16 >> uVar18 == 0; uVar18 = uVar18 - 1) {
            }
          }
          uVar20 = (ulong)((uint)((uVar14 >> ((ulong)(byte)(0x26 - (char)(uVar18 ^ 0x1f)) & 0x3f) &
                                  1) != 0) | (uVar18 ^ 0x1f) * 2 ^ 0x3e);
        }
      }
      puVar15 = (undefined8 *)((long)msp + uVar20 * 8 + 0x248);
      *(ulong *)(pauVar4[3] + 8) = uVar20;
      pauVar4[2] = (undefined1  [16])0x0;
      if ((*(uint *)((long)msp + 4) >> ((uint)uVar20 & 0x1f) & 1) == 0) {
        *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar20 & 0x1f);
        *puVar15 = pauVar4;
        *(undefined8 **)pauVar4[3] = puVar15;
      }
      else {
        bVar23 = 0x39 - (char)(uVar20 >> 1);
        if (uVar20 == 0x1f) {
          bVar23 = 0;
        }
        lVar10 = uVar14 << (bVar23 & 0x3f);
        pauVar13 = (undefined1 (*) [16])*puVar15;
        do {
          pauVar11 = pauVar13;
          if ((*(ulong *)(*pauVar11 + 8) & 0xfffffffffffffffc) == uVar14) {
            lVar10 = *(long *)pauVar11[1];
            *(undefined1 (**) [16])(lVar10 + 0x18) = pauVar4;
            *(undefined1 (**) [16])pauVar11[1] = pauVar4;
            *(long *)pauVar4[1] = lVar10;
            lVar10 = 0x30;
            lVar21 = 0x18;
            pauVar13 = (undefined1 (*) [16])0x0;
            goto LAB_0011f40e;
          }
          lVar21 = lVar10 >> 0x3f;
          lVar10 = lVar10 * 2;
          pauVar13 = *(undefined1 (**) [16])((long)pauVar11 + lVar21 * -8 + 0x20);
        } while (pauVar13 != (undefined1 (*) [16])0x0);
        *(undefined1 (**) [16])((long)pauVar11 + lVar21 * -8 + 0x20) = pauVar4;
        *(undefined1 (**) [16])pauVar4[3] = pauVar11;
      }
      lVar10 = 0x10;
      lVar21 = 0x18;
      pauVar11 = pauVar4;
      pauVar13 = pauVar4;
    }
LAB_0011f40e:
    *(undefined1 (**) [16])(*pauVar4 + lVar21) = pauVar11;
    *(undefined1 (**) [16])(*pauVar4 + lVar10) = pauVar13;
  }
LAB_0011f416:
  uVar14 = *(ulong *)((long)msp + 0x10) - uVar12;
  if (*(ulong *)((long)msp + 0x10) < uVar12 || uVar14 == 0) {
    return (void *)0x0;
  }
LAB_0011ebd9:
  *(ulong *)((long)msp + 0x10) = uVar14;
  lVar10 = *(long *)((long)msp + 0x20);
  *(ulong *)((long)msp + 0x20) = lVar10 + uVar12;
  *(ulong *)(lVar10 + 8 + uVar12) = uVar14 | 1;
  *(ulong *)(lVar10 + 8) = uVar12 | 3;
LAB_0011ecb7:
  return (void *)(lVar10 + 0x10);
}

Assistant:

static LJ_NOINLINE void *lj_alloc_malloc(void *msp, size_t nsize)
{
  mstate ms = (mstate)msp;
  void *mem;
  size_t nb;
  if (nsize <= MAX_SMALL_REQUEST) {
    bindex_t idx;
    binmap_t smallbits;
    nb = (nsize < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(nsize);
    idx = small_index(nb);
    smallbits = ms->smallmap >> idx;

    if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
      mchunkptr b, p;
      idx += ~smallbits & 1;       /* Uses next bin if idx empty */
      b = smallbin_at(ms, idx);
      p = b->fd;
      unlink_first_small_chunk(ms, b, p, idx);
      set_inuse_and_pinuse(ms, p, small_index2size(idx));
      mem = chunk2mem(p);
      return mem;
    } else if (nb > ms->dvsize) {
      if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
	mchunkptr b, p, r;
	size_t rsize;
	binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
	bindex_t i = lj_ffs(leftbits);
	b = smallbin_at(ms, i);
	p = b->fd;
	unlink_first_small_chunk(ms, b, p, i);
	rsize = small_index2size(i) - nb;
	/* Fit here cannot be remainderless if 4byte sizes */
	if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE) {
	  set_inuse_and_pinuse(ms, p, small_index2size(i));
	} else {
	  set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
	  r = chunk_plus_offset(p, nb);
	  set_size_and_pinuse_of_free_chunk(r, rsize);
	  replace_dv(ms, r, rsize);
	}
	mem = chunk2mem(p);
	return mem;
      } else if (ms->treemap != 0 && (mem = tmalloc_small(ms, nb)) != 0) {
	return mem;
      }
    }
  } else if (nsize >= MAX_REQUEST) {
    nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
  } else {
    nb = pad_request(nsize);
    if (ms->treemap != 0 && (mem = tmalloc_large(ms, nb)) != 0) {
      return mem;
    }
  }

  if (nb <= ms->dvsize) {
    size_t rsize = ms->dvsize - nb;
    mchunkptr p = ms->dv;
    if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
      mchunkptr r = ms->dv = chunk_plus_offset(p, nb);
      ms->dvsize = rsize;
      set_size_and_pinuse_of_free_chunk(r, rsize);
      set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
    } else { /* exhaust dv */
      size_t dvs = ms->dvsize;
      ms->dvsize = 0;
      ms->dv = 0;
      set_inuse_and_pinuse(ms, p, dvs);
    }
    mem = chunk2mem(p);
    return mem;
  } else if (nb < ms->topsize) { /* Split top */
    size_t rsize = ms->topsize -= nb;
    mchunkptr p = ms->top;
    mchunkptr r = ms->top = chunk_plus_offset(p, nb);
    r->head = rsize | PINUSE_BIT;
    set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
    mem = chunk2mem(p);
    return mem;
  }
  return alloc_sys(ms, nb);
}